

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::texcoord2h>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,texcoord2h *v)

{
  half hVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<tinyusdz::value::texcoord2h> local_54;
  optional<tinyusdz::value::texcoord2h> local_4e;
  bool bStack_48;
  undefined3 uStack_47;
  optional<tinyusdz::value::texcoord2h> pv_1;
  optional<tinyusdz::value::texcoord2h> local_3e;
  optional<tinyusdz::value::texcoord2h> pv;
  texcoord2h *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (texcoord2h *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_002f4524;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)&stack0xffffffffffffffc8,t);
  bVar2 = tinyusdz::value::TimeCode::is_default((TimeCode *)&stack0xffffffffffffffc8);
  if (bVar2) {
    get_default_value<tinyusdz::value::texcoord2h>
              ((optional<tinyusdz::value::texcoord2h> *)
               &((optional<tinyusdz::value::texcoord2h> *)((long)register0x00000020 + -0x46))->
                contained,this);
    nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::
    optional<tinyusdz::value::texcoord2h,_0>
              (&local_3e,
               (optional<tinyusdz::value::texcoord2h> *)
               &((optional<tinyusdz::value::texcoord2h> *)((long)register0x00000020 + -0x46))->
                contained);
    nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::~optional
              ((optional<tinyusdz::value::texcoord2h> *)
               &((optional<tinyusdz::value::texcoord2h> *)((long)register0x00000020 + -0x46))->
                contained);
    bStack_48 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_3e);
    if (bStack_48) {
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::value(&local_3e);
      hVar1.value = (pvVar3->t).value;
      v->s = (half)(pvVar3->s).value;
      v->t = (half)hVar1.value;
      this_local._7_1_ = 1;
    }
    uStack_47 = 0;
    nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::~optional(&local_3e);
    if (_bStack_48 != 0) goto LAB_002f4524;
    bVar2 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar2) {
      this_local._7_1_ = 0;
      goto LAB_002f4524;
    }
  }
  bVar2 = has_timesamples(this);
  if (bVar2) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<tinyusdz::value::texcoord2h,_nullptr>
                   (&this->_ts,v,t,tinterp);
  }
  else {
    bVar2 = has_default(this);
    if (bVar2) {
      get_default_value<tinyusdz::value::texcoord2h>(&local_54,this);
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::
      optional<tinyusdz::value::texcoord2h,_0>(&local_4e,&local_54);
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::~optional(&local_54);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_4e);
      if (bVar2) {
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::value(&local_4e);
        hVar1.value = (pvVar3->t).value;
        v->s = (half)(pvVar3->s).value;
        v->t = (half)hVar1.value;
        this_local._7_1_ = 1;
      }
      uStack_47 = 0;
      bStack_48 = bVar2;
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::~optional(&local_4e);
      if (_bStack_48 != 0) goto LAB_002f4524;
    }
    this_local._7_1_ = 0;
  }
LAB_002f4524:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }